

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9Sat3(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  uint fSplit;
  char *pcVar4;
  int iVar5;
  satoko_opts_t opts;
  satoko_opts_t local_98;
  
  satoko_default_opts(&local_98);
  fSplit = 0;
  Extra_UtilGetoptReset();
  bVar1 = false;
  do {
    while (iVar2 = Extra_UtilGetopt(argc,argv,"Csivh"), iVar5 = globalUtilOptind, 0x68 < iVar2) {
      if (iVar2 == 0x76) {
        local_98.verbose = local_98.verbose ^ 1;
      }
      else if (iVar2 == 0x69) {
        bVar1 = (bool)(bVar1 ^ 1);
      }
      else {
        if (iVar2 != 0x73) goto LAB_0026fba0;
        fSplit = fSplit ^ 1;
      }
    }
    if (iVar2 != 0x43) {
      if (iVar2 == -1) {
        if (pAbc->pGia != (Gia_Man_t *)0x0) {
          Gia_ManSat3Call(pAbc->pGia,fSplit);
          return 0;
        }
        pcVar3 = "Abc_CommandAbc9Sat3(): There is no AIG.\n";
        iVar5 = -1;
        goto LAB_0026fc3f;
      }
      break;
    }
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
      break;
    }
    iVar2 = atoi(argv[globalUtilOptind]);
    local_98.conf_limit = (long)iVar2;
    globalUtilOptind = iVar5 + 1;
  } while (-1 < iVar2);
LAB_0026fba0:
  Abc_Print(-2,"usage: &sat3 [-C num] [-sivh]\n");
  Abc_Print(-2,"\t-C num : limit on the number of conflicts [default = %d]\n",local_98.conf_limit);
  pcVar4 = "yes";
  pcVar3 = "yes";
  if (fSplit == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-s     : split multi-output miter into individual outputs [default = %s]\n",pcVar3
           );
  pcVar3 = "yes";
  if (!bVar1) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-i     : split multi-output miter and solve incrementally [default = %s]\n",pcVar3
           );
  if (local_98.verbose == 0) {
    pcVar4 = "no";
  }
  Abc_Print(-2,"\t-v     : prints verbose information [default = %s]\n",pcVar4);
  pcVar3 = "\t-h     : print the command usage\n";
  iVar5 = -2;
LAB_0026fc3f:
  Abc_Print(iVar5,pcVar3);
  return 1;
}

Assistant:

int Abc_CommandAbc9Sat3( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Gia_ManSat3Call( Gia_Man_t * p, int fSplit );
    int c, fSplit = 0, fIncrem = 0;

    satoko_opts_t opts;
    satoko_default_opts(&opts);
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Csivh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            opts.conf_limit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( opts.conf_limit < 0 )
                goto usage;
            break;
        case 's':
            fSplit ^= 1;
            break;
        case 'i':
            fIncrem ^= 1;
            break;
        case 'v':
            opts.verbose ^= 1;
            break;
        case 'h':
            goto usage;

        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Sat3(): There is no AIG.\n" );
        return 1;
    }
    Gia_ManSat3Call( pAbc->pGia, fSplit );
    return 0;

usage:
    Abc_Print( -2, "usage: &sat3 [-C num] [-sivh]\n" );
    Abc_Print( -2, "\t-C num : limit on the number of conflicts [default = %d]\n", opts.conf_limit );
    Abc_Print( -2, "\t-s     : split multi-output miter into individual outputs [default = %s]\n", fSplit? "yes": "no" );
    Abc_Print( -2, "\t-i     : split multi-output miter and solve incrementally [default = %s]\n", fIncrem? "yes": "no" );
    Abc_Print( -2, "\t-v     : prints verbose information [default = %s]\n", opts.verbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}